

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_2_channels_with_n_coeffs_mod0
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 uVar1;
  __m128 cs;
  __m128 c;
  __m128 tot1;
  __m128 tot0;
  float *local_260;
  float *hc;
  float *pfStack_250;
  int n;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_230;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  
  decode = output_buffer;
  pfStack_230 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfStack_250 = decode_buffer + (int)*horizontal_coefficients_local * 2;
    hc._4_4_ = (int)horizontal_coefficients_local[1] - (int)*horizontal_coefficients_local >> 2;
    local_260 = pfStack_230;
    local_138 = (float)*(undefined8 *)pfStack_230;
    fStack_134 = (float)((ulong)*(undefined8 *)pfStack_230 >> 0x20);
    local_c8 = (float)*(undefined8 *)pfStack_250;
    fStack_c4 = (float)((ulong)*(undefined8 *)pfStack_250 >> 0x20);
    fStack_c0 = (float)*(undefined8 *)(pfStack_250 + 2);
    fStack_bc = (float)((ulong)*(undefined8 *)(pfStack_250 + 2) >> 0x20);
    tot1[2] = local_138 * local_c8;
    tot1[3] = local_138 * fStack_c4;
    tot0[0] = fStack_134 * fStack_c0;
    tot0[1] = fStack_134 * fStack_bc;
    fStack_140 = (float)*(undefined8 *)(pfStack_230 + 2);
    fStack_13c = (float)((ulong)*(undefined8 *)(pfStack_230 + 2) >> 0x20);
    local_e8 = (float)*(undefined8 *)(pfStack_250 + 4);
    fStack_e4 = (float)((ulong)*(undefined8 *)(pfStack_250 + 4) >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(pfStack_250 + 6);
    fStack_dc = (float)((ulong)*(undefined8 *)(pfStack_250 + 6) >> 0x20);
    c[2] = fStack_140 * local_e8;
    c[3] = fStack_140 * fStack_e4;
    tot1[0] = fStack_13c * fStack_e0;
    tot1[1] = fStack_13c * fStack_dc;
    do {
      uVar1 = *(undefined8 *)(local_260 + 4);
      local_158 = (float)uVar1;
      fStack_154 = (float)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)(pfStack_250 + 8);
      local_108 = (float)uVar1;
      fStack_104 = (float)((ulong)uVar1 >> 0x20);
      fStack_100 = (float)*(undefined8 *)(pfStack_250 + 10);
      fStack_fc = (float)((ulong)*(undefined8 *)(pfStack_250 + 10) >> 0x20);
      tot1[2] = tot1[2] + local_158 * local_108;
      tot1[3] = tot1[3] + local_158 * fStack_104;
      tot0[0] = tot0[0] + fStack_154 * fStack_100;
      tot0[1] = tot0[1] + fStack_154 * fStack_fc;
      fStack_160 = (float)*(undefined8 *)(local_260 + 6);
      fStack_15c = (float)((ulong)*(undefined8 *)(local_260 + 6) >> 0x20);
      local_128 = (float)*(undefined8 *)(pfStack_250 + 0xc);
      fStack_124 = (float)((ulong)*(undefined8 *)(pfStack_250 + 0xc) >> 0x20);
      fStack_120 = (float)*(undefined8 *)(pfStack_250 + 0xe);
      fStack_11c = (float)((ulong)*(undefined8 *)(pfStack_250 + 0xe) >> 0x20);
      c[2] = c[2] + fStack_160 * local_128;
      c[3] = c[3] + fStack_160 * fStack_124;
      tot1[0] = tot1[0] + fStack_15c * fStack_120;
      tot1[1] = tot1[1] + fStack_15c * fStack_11c;
      hc._4_4_ = hc._4_4_ + -1;
      local_260 = local_260 + 4;
      pfStack_250 = pfStack_250 + 8;
    } while (0 < hc._4_4_);
    *(ulong *)decode =
         CONCAT44(tot1[3] + c[3] + tot0[1] + tot1[1],tot1[2] + c[2] + tot0[0] + tot1[0]);
    pfStack_230 = pfStack_230 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 2;
  } while (decode < output_buffer + (output_sub_size << 1));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod0 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 4 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__store_output();
  } while ( output < output_end );
}